

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cc
# Opt level: O1

double __thiscall calculator::ExpressionTree::calcValue(ExpressionTree *this,node *x)

{
  Tag tag;
  node *y;
  node *x_00;
  pointer pcVar1;
  double dVar2;
  Integer IVar3;
  ExpressionTree *this_00;
  _Alloc_hider _Var4;
  node *x_01;
  undefined4 uVar5;
  undefined4 uVar6;
  string local_70;
  string local_50;
  
  if (x == (node *)0x0) {
    return 0.0;
  }
  dVar2 = calcValue(this,x->left);
  if (x->left != (node *)0x0) {
    x->left->value = dVar2;
  }
  this_00 = this;
  dVar2 = calcValue(this,x->right);
  y = x->right;
  if (y != (node *)0x0) {
    y->value = dVar2;
  }
  x_00 = x->left;
  x_01 = x_00;
  if (x_00 == (node *)0x0) {
    x_01 = y;
  }
  tag = x->type;
  if ((int)tag < 7) {
    if (tag < Identifier) {
      return x->value;
    }
    if (tag != Not) {
LAB_00107c3d:
      dVar2 = calcValue(this,x_00,y,tag);
      return dVar2;
    }
LAB_00107c29:
    IVar3 = calcValue(this_00,x_01,tag);
    return (double)IVar3;
  }
  if (tag == Negate) goto LAB_00107c29;
  if (tag == Function) {
    pcVar1 = (x->funcname)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + (x->funcname)._M_string_length);
    dVar2 = calcFunctionValue(this,x_01,&local_50);
    uVar5 = SUB84(dVar2,0);
    uVar6 = (undefined4)((ulong)dVar2 >> 0x20);
    _Var4._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_00107ca9;
  }
  else {
    if (tag != BinaryFunction) goto LAB_00107c3d;
    pcVar1 = (x->funcname)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + (x->funcname)._M_string_length);
    dVar2 = calcBinaryFunctionValuie(this,x_00,y,&local_70);
    uVar5 = SUB84(dVar2,0);
    uVar6 = (undefined4)((ulong)dVar2 >> 0x20);
    local_50.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
    _Var4._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_00107ca9;
  }
  operator_delete(_Var4._M_p,local_50.field_2._M_allocated_capacity + 1);
LAB_00107ca9:
  if (x->negative == false) {
    return (double)CONCAT44(uVar6,uVar5);
  }
  return -(double)CONCAT44(uVar6,uVar5);
}

Assistant:

double ExpressionTree::calcValue(node *x) {
    if (!x) return 0.0;

    // 更新操作符节点中的值
    double l = calcValue(x->left);
    if (x->left) x->left->value = l;
    double r = calcValue(x->right);
    if (x->right) x->right->value = r;

    node *valid_child = x->left ? x->left : x->right;
    if (x->type == Tag::Number || x->type == Tag::Float) return x->value;

    // 计算一元函数
    else if (x->type == Tag::Function) {
        double val = calcFunctionValue(valid_child, x->funcname);
        if (x->negative) return -val;
        return val;
    }
    // 计算二元函数
    else if (x->type == Tag::BinaryFunction) {
        double val = calcBinaryFunctionValuie(x->left, x->right, x->funcname);
        if (x->negative) return -val;
        return val;
    }
    // 计算一元操作符
    else if (x->type == Tag::Not || x->type == Tag::Negate)
        return (double)calcValue(valid_child, x->type);
    // 根据当前节点的tag 从孩子节点计算值 并存储到当前节点的 node.value 中
    return calcValue(x->left, x->right, x->type);
}